

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtAlignedObjectArray.h
# Opt level: O2

void __thiscall
cbtAlignedObjectArray<cbtDbvt::sStkCLN>::push_back
          (cbtAlignedObjectArray<cbtDbvt::sStkCLN> *this,sStkCLN *_Val)

{
  sStkCLN *psVar1;
  cbtDbvtNode *pcVar2;
  int iVar3;
  int _Count;
  
  iVar3 = this->m_size;
  if (iVar3 == this->m_capacity) {
    _Count = 1;
    if (iVar3 != 0) {
      _Count = iVar3 * 2;
    }
    reserve(this,_Count);
    iVar3 = this->m_size;
  }
  pcVar2 = _Val->parent;
  psVar1 = this->m_data;
  psVar1[iVar3].node = _Val->node;
  psVar1[iVar3].parent = pcVar2;
  this->m_size = this->m_size + 1;
  return;
}

Assistant:

SIMD_FORCE_INLINE void push_back(const T& _Val)
	{
		const int sz = size();
		if (sz == capacity())
		{
			reserve(allocSize(size()));
		}

#ifdef BT_USE_PLACEMENT_NEW
		new (&m_data[m_size]) T(_Val);
#else
		m_data[size()] = _Val;
#endif  //BT_USE_PLACEMENT_NEW

		m_size++;
	}